

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ec_sign.c
# Opt level: O0

int gost_ec_point_mul(EC_GROUP *group,EC_POINT *r,BIGNUM *n,EC_POINT *q,BIGNUM *m,BN_CTX *ctx)

{
  int iVar1;
  EC_POINT *in_RCX;
  BIGNUM *in_RDX;
  EC_POINT *in_RSI;
  EC_GROUP *in_RDI;
  BIGNUM *in_R8;
  BN_CTX *in_R9;
  EC_GROUP *in_stack_00000040;
  EC_POINT *in_stack_00000048;
  EC_GROUP *in_stack_00000050;
  EC_POINT *in_stack_00000058;
  BIGNUM *in_stack_00000060;
  EC_POINT *in_stack_00000068;
  EC_GROUP *in_stack_00000070;
  BN_CTX *in_stack_00000088;
  BIGNUM *in_stack_00000090;
  EC_POINT *in_stack_00000098;
  EC_GROUP *in_stack_000000a0;
  EC_POINT *in_stack_000000a8;
  EC_GROUP *in_stack_000000b0;
  BN_CTX *in_stack_000000c8;
  BIGNUM *in_stack_000000d0;
  EC_POINT *in_stack_000000d8;
  BIGNUM *in_stack_000000e0;
  EC_POINT *in_stack_000000e8;
  EC_GROUP *in_stack_000000f0;
  
  if (((in_RDI == (EC_GROUP *)0x0) || (in_RSI == (EC_POINT *)0x0)) || (in_R9 == (BN_CTX *)0x0)) {
    return 0;
  }
  if ((in_R8 == (BIGNUM *)0x0) || (in_RDX == (BIGNUM *)0x0)) {
    if (in_RDX == (BIGNUM *)0x0) {
      if (in_R8 == (BIGNUM *)0x0) {
        return 0;
      }
      if (in_RCX == (EC_POINT *)0x0) {
        return 0;
      }
      iVar1 = EC_GROUP_get_curve_name(in_RDI);
      if (iVar1 == 0x347) {
        iVar1 = point_mul_id_GostR3410_2001_TestParamSet
                          (in_stack_00000050,in_stack_00000048,(EC_POINT *)in_stack_00000040,
                           (BIGNUM *)group,(BN_CTX *)r);
        return iVar1;
      }
      if (iVar1 == 0x348) goto LAB_0012ccb9;
      if (iVar1 == 0x349) {
LAB_0012cce0:
        iVar1 = point_mul_id_GostR3410_2001_CryptoPro_B_ParamSet
                          (in_stack_00000050,in_stack_00000048,(EC_POINT *)in_stack_00000040,
                           (BIGNUM *)group,(BN_CTX *)r);
        return iVar1;
      }
      if (iVar1 != 0x34a) {
        if (iVar1 == 0x34b) {
LAB_0012ccb9:
          iVar1 = point_mul_id_GostR3410_2001_CryptoPro_A_ParamSet
                            (in_stack_00000050,in_stack_00000048,(EC_POINT *)in_stack_00000040,
                             (BIGNUM *)group,(BN_CTX *)r);
          return iVar1;
        }
        if (iVar1 != 0x34c) {
          if (iVar1 == 0x3e6) {
            iVar1 = point_mul_id_tc26_gost_3410_2012_512_paramSetA
                              (in_stack_000000b0,in_stack_000000a8,(EC_POINT *)in_stack_000000a0,
                               (BIGNUM *)in_stack_00000098,(BN_CTX *)in_stack_00000090);
            return iVar1;
          }
          if (iVar1 == 999) {
            iVar1 = point_mul_id_tc26_gost_3410_2012_512_paramSetB
                              (in_stack_000000b0,in_stack_000000a8,(EC_POINT *)in_stack_000000a0,
                               (BIGNUM *)in_stack_00000098,(BN_CTX *)in_stack_00000090);
            return iVar1;
          }
          if (iVar1 == 0x47c) {
            iVar1 = point_mul_id_tc26_gost_3410_2012_256_paramSetA
                              (in_stack_00000050,in_stack_00000048,(EC_POINT *)in_stack_00000040,
                               (BIGNUM *)group,(BN_CTX *)r);
            return iVar1;
          }
          if (iVar1 == 0x47d) {
            iVar1 = point_mul_id_tc26_gost_3410_2012_512_paramSetC
                              (in_stack_000000b0,in_stack_000000a8,(EC_POINT *)in_stack_000000a0,
                               (BIGNUM *)in_stack_00000098,(BN_CTX *)in_stack_00000090);
            return iVar1;
          }
          if (iVar1 == 0x4a0) goto LAB_0012ccb9;
          if (iVar1 == 0x4a1) goto LAB_0012cce0;
          if (iVar1 != 0x4a2) {
            iVar1 = EC_POINT_mul(in_RDI,in_RSI,(BIGNUM *)0x0,in_RCX,in_R8,in_R9);
            return iVar1;
          }
        }
      }
      iVar1 = point_mul_id_GostR3410_2001_CryptoPro_C_ParamSet
                        (in_stack_00000050,in_stack_00000048,(EC_POINT *)in_stack_00000040,
                         (BIGNUM *)group,(BN_CTX *)r);
      return iVar1;
    }
    iVar1 = EC_GROUP_get_curve_name(in_RDI);
    if (iVar1 == 0x347) {
      iVar1 = point_mul_g_id_GostR3410_2001_TestParamSet
                        (in_stack_00000040,(EC_POINT *)group,(BIGNUM *)r,(BN_CTX *)n);
      return iVar1;
    }
    if (iVar1 == 0x348) goto LAB_0012ca7c;
    if (iVar1 == 0x349) {
LAB_0012ca9e:
      iVar1 = point_mul_g_id_GostR3410_2001_CryptoPro_B_ParamSet
                        (in_stack_00000040,(EC_POINT *)group,(BIGNUM *)r,(BN_CTX *)n);
      return iVar1;
    }
    if (iVar1 != 0x34a) {
      if (iVar1 == 0x34b) {
LAB_0012ca7c:
        iVar1 = point_mul_g_id_GostR3410_2001_CryptoPro_A_ParamSet
                          (in_stack_00000040,(EC_POINT *)group,(BIGNUM *)r,(BN_CTX *)n);
        return iVar1;
      }
      if (iVar1 != 0x34c) {
        if (iVar1 == 0x3e6) {
          iVar1 = point_mul_g_id_tc26_gost_3410_2012_512_paramSetA
                            (in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_00000088
                            );
          return iVar1;
        }
        if (iVar1 == 999) {
          iVar1 = point_mul_g_id_tc26_gost_3410_2012_512_paramSetB
                            (in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_00000088
                            );
          return iVar1;
        }
        if (iVar1 == 0x47c) {
          iVar1 = point_mul_g_id_tc26_gost_3410_2012_256_paramSetA
                            (in_stack_00000040,(EC_POINT *)group,(BIGNUM *)r,(BN_CTX *)n);
          return iVar1;
        }
        if (iVar1 == 0x47d) {
          iVar1 = point_mul_g_id_tc26_gost_3410_2012_512_paramSetC
                            (in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_00000088
                            );
          return iVar1;
        }
        if (iVar1 == 0x4a0) goto LAB_0012ca7c;
        if (iVar1 == 0x4a1) goto LAB_0012ca9e;
        if (iVar1 != 0x4a2) {
          iVar1 = EC_POINT_mul(in_RDI,in_RSI,in_RDX,in_RCX,in_R8,in_R9);
          return iVar1;
        }
      }
    }
    iVar1 = point_mul_g_id_GostR3410_2001_CryptoPro_C_ParamSet
                      (in_stack_00000040,(EC_POINT *)group,(BIGNUM *)r,(BN_CTX *)n);
    return iVar1;
  }
  if (in_RCX == (EC_POINT *)0x0) {
    return 0;
  }
  iVar1 = EC_GROUP_get_curve_name(in_RDI);
  if (iVar1 == 0x347) {
    iVar1 = point_mul_two_id_GostR3410_2001_TestParamSet
                      (in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058,
                       (BIGNUM *)in_stack_00000050,(BN_CTX *)in_stack_00000048);
    return iVar1;
  }
  if (iVar1 == 0x348) goto LAB_0012c804;
  if (iVar1 == 0x349) {
LAB_0012c830:
    iVar1 = point_mul_two_id_GostR3410_2001_CryptoPro_B_ParamSet
                      (in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058,
                       (BIGNUM *)in_stack_00000050,(BN_CTX *)in_stack_00000048);
    return iVar1;
  }
  if (iVar1 != 0x34a) {
    if (iVar1 == 0x34b) {
LAB_0012c804:
      iVar1 = point_mul_two_id_GostR3410_2001_CryptoPro_A_ParamSet
                        (in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058,
                         (BIGNUM *)in_stack_00000050,(BN_CTX *)in_stack_00000048);
      return iVar1;
    }
    if (iVar1 != 0x34c) {
      if (iVar1 == 0x3e6) {
        iVar1 = point_mul_two_id_tc26_gost_3410_2012_512_paramSetA
                          (in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,
                           in_stack_000000d0,in_stack_000000c8);
        return iVar1;
      }
      if (iVar1 == 999) {
        iVar1 = point_mul_two_id_tc26_gost_3410_2012_512_paramSetB
                          (in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,
                           in_stack_000000d0,in_stack_000000c8);
        return iVar1;
      }
      if (iVar1 == 0x47c) {
        iVar1 = point_mul_two_id_tc26_gost_3410_2012_256_paramSetA
                          (in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058,
                           (BIGNUM *)in_stack_00000050,(BN_CTX *)in_stack_00000048);
        return iVar1;
      }
      if (iVar1 == 0x47d) {
        iVar1 = point_mul_two_id_tc26_gost_3410_2012_512_paramSetC
                          (in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,
                           in_stack_000000d0,in_stack_000000c8);
        return iVar1;
      }
      if (iVar1 == 0x4a0) goto LAB_0012c804;
      if (iVar1 == 0x4a1) goto LAB_0012c830;
      if (iVar1 != 0x4a2) {
        iVar1 = EC_POINT_mul(in_RDI,in_RSI,in_RDX,in_RCX,in_R8,in_R9);
        return iVar1;
      }
    }
  }
  iVar1 = point_mul_two_id_GostR3410_2001_CryptoPro_C_ParamSet
                    (in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058,
                     (BIGNUM *)in_stack_00000050,(BN_CTX *)in_stack_00000048);
  return iVar1;
}

Assistant:

int gost_ec_point_mul(const EC_GROUP *group, EC_POINT *r, const BIGNUM *n,
                      const EC_POINT *q, const BIGNUM *m, BN_CTX *ctx)
{
    if (group == NULL || r == NULL || ctx == NULL)
        return 0;

    if (m != NULL && n != NULL) {
        /* verification */
        if (q == NULL)
            return 0;
        switch(EC_GROUP_get_curve_name(group)) {
            case NID_id_GostR3410_2001_CryptoPro_A_ParamSet:
            case NID_id_GostR3410_2001_CryptoPro_XchA_ParamSet:
            case NID_id_tc26_gost_3410_2012_256_paramSetB:
                return point_mul_two_id_GostR3410_2001_CryptoPro_A_ParamSet(group, r, n, q, m, ctx);
            case NID_id_GostR3410_2001_CryptoPro_B_ParamSet:
            case NID_id_tc26_gost_3410_2012_256_paramSetC:
                return point_mul_two_id_GostR3410_2001_CryptoPro_B_ParamSet(group, r, n, q, m, ctx);
            case NID_id_GostR3410_2001_CryptoPro_C_ParamSet:
            case NID_id_GostR3410_2001_CryptoPro_XchB_ParamSet:
            case NID_id_tc26_gost_3410_2012_256_paramSetD:
                return point_mul_two_id_GostR3410_2001_CryptoPro_C_ParamSet(group, r, n, q, m, ctx);
            case NID_id_GostR3410_2001_TestParamSet:
                return point_mul_two_id_GostR3410_2001_TestParamSet(group, r, n, q, m, ctx);
            case NID_id_tc26_gost_3410_2012_256_paramSetA:
                return point_mul_two_id_tc26_gost_3410_2012_256_paramSetA(group, r, n, q, m, ctx);
            case NID_id_tc26_gost_3410_2012_512_paramSetA:
                return point_mul_two_id_tc26_gost_3410_2012_512_paramSetA(group, r, n, q, m, ctx);
            case NID_id_tc26_gost_3410_2012_512_paramSetB:
                return point_mul_two_id_tc26_gost_3410_2012_512_paramSetB(group, r, n, q, m, ctx);
            case NID_id_tc26_gost_3410_2012_512_paramSetC:
                return point_mul_two_id_tc26_gost_3410_2012_512_paramSetC(group, r, n, q, m, ctx);
            default:
                return EC_POINT_mul(group, r, n, q, m, ctx);
        }
    } else if (n != NULL) {
        /* mul g */
        switch(EC_GROUP_get_curve_name(group)) {
            case NID_id_GostR3410_2001_CryptoPro_A_ParamSet:
            case NID_id_GostR3410_2001_CryptoPro_XchA_ParamSet:
            case NID_id_tc26_gost_3410_2012_256_paramSetB:
                return point_mul_g_id_GostR3410_2001_CryptoPro_A_ParamSet(group, r, n, ctx);
            case NID_id_GostR3410_2001_CryptoPro_B_ParamSet:
            case NID_id_tc26_gost_3410_2012_256_paramSetC:
                return point_mul_g_id_GostR3410_2001_CryptoPro_B_ParamSet(group, r, n, ctx);
            case NID_id_GostR3410_2001_CryptoPro_C_ParamSet:
            case NID_id_GostR3410_2001_CryptoPro_XchB_ParamSet:
            case NID_id_tc26_gost_3410_2012_256_paramSetD:
                return point_mul_g_id_GostR3410_2001_CryptoPro_C_ParamSet(group, r, n, ctx);
            case NID_id_GostR3410_2001_TestParamSet:
                return point_mul_g_id_GostR3410_2001_TestParamSet(group, r, n, ctx);
            case NID_id_tc26_gost_3410_2012_256_paramSetA:
                return point_mul_g_id_tc26_gost_3410_2012_256_paramSetA(group, r, n, ctx);
            case NID_id_tc26_gost_3410_2012_512_paramSetA:
                return point_mul_g_id_tc26_gost_3410_2012_512_paramSetA(group, r, n, ctx);
            case NID_id_tc26_gost_3410_2012_512_paramSetB:
                return point_mul_g_id_tc26_gost_3410_2012_512_paramSetB(group, r, n, ctx);
            case NID_id_tc26_gost_3410_2012_512_paramSetC:
                return point_mul_g_id_tc26_gost_3410_2012_512_paramSetC(group, r, n, ctx);
            default:
                return EC_POINT_mul(group, r, n, q, m, ctx);
        }
    } else if (m != NULL) {
        if (q == NULL)
            return 0;
        /* mul */
        switch(EC_GROUP_get_curve_name(group)) {
            case NID_id_GostR3410_2001_CryptoPro_A_ParamSet:
            case NID_id_GostR3410_2001_CryptoPro_XchA_ParamSet:
            case NID_id_tc26_gost_3410_2012_256_paramSetB:
                return point_mul_id_GostR3410_2001_CryptoPro_A_ParamSet(group, r, q, m, ctx);
            case NID_id_GostR3410_2001_CryptoPro_B_ParamSet:
            case NID_id_tc26_gost_3410_2012_256_paramSetC:
                return point_mul_id_GostR3410_2001_CryptoPro_B_ParamSet(group, r, q, m, ctx);
            case NID_id_GostR3410_2001_CryptoPro_C_ParamSet:
            case NID_id_GostR3410_2001_CryptoPro_XchB_ParamSet:
            case NID_id_tc26_gost_3410_2012_256_paramSetD:
                return point_mul_id_GostR3410_2001_CryptoPro_C_ParamSet(group, r, q, m, ctx);
            case NID_id_GostR3410_2001_TestParamSet:
                return point_mul_id_GostR3410_2001_TestParamSet(group, r, q, m, ctx);
            case NID_id_tc26_gost_3410_2012_256_paramSetA:
                return point_mul_id_tc26_gost_3410_2012_256_paramSetA(group, r, q, m, ctx);
            case NID_id_tc26_gost_3410_2012_512_paramSetA:
                return point_mul_id_tc26_gost_3410_2012_512_paramSetA(group, r, q, m, ctx);
            case NID_id_tc26_gost_3410_2012_512_paramSetB:
                return point_mul_id_tc26_gost_3410_2012_512_paramSetB(group, r, q, m, ctx);
            case NID_id_tc26_gost_3410_2012_512_paramSetC:
                return point_mul_id_tc26_gost_3410_2012_512_paramSetC(group, r, q, m, ctx);
            default:
                return EC_POINT_mul(group, r, n, q, m, ctx);
        }
    }
    return 0;
}